

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrNtbdd.c
# Opt level: O3

DdManager *
Aig_ManComputeGlobalBdds(Aig_Man_t *p,int nBddSizeMax,int fDropInternal,int fReorder,int fVerbose)

{
  void *pvVar1;
  DdManager *unique;
  Vec_Ptr_t *pVVar2;
  DdNode *pDVar3;
  long lVar4;
  int Counter;
  int local_34;
  
  unique = Cudd_Init(p->nObjs[2],0,0x100,0x40000,0);
  if (fReorder != 0) {
    Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  }
  Aig_ManCleanData(p);
  pDVar3 = unique->one;
  (p->pConst1->field_5).pData = pDVar3;
  Cudd_Ref(pDVar3);
  pVVar2 = p->vCis;
  if (0 < pVVar2->nSize) {
    lVar4 = 0;
    do {
      *(DdNode **)((long)pVVar2->pArray[lVar4] + 0x28) = unique->vars[lVar4];
      Cudd_Ref(unique->vars[lVar4]);
      lVar4 = lVar4 + 1;
      pVVar2 = p->vCis;
    } while (lVar4 < pVVar2->nSize);
  }
  local_34 = 0;
  pVVar2 = p->vCos;
  if (0 < pVVar2->nSize) {
    lVar4 = 0;
    do {
      pvVar1 = pVVar2->pArray[lVar4];
      pDVar3 = Bbr_NodeGlobalBdds_rec
                         (unique,(Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe),
                          nBddSizeMax,fDropInternal,(ProgressBar *)0x0,&local_34,fVerbose);
      if (pDVar3 == (DdNode *)0x0) {
        if (fVerbose != 0) {
          puts("Constructing global BDDs is aborted.");
        }
        Aig_ManFreeGlobalBdds(p,unique);
        Cudd_Quit(unique);
        Aig_ManResetRefs(p);
        return (DdManager *)0x0;
      }
      pDVar3 = (DdNode *)((ulong)((uint)*(undefined8 *)((long)pvVar1 + 8) & 1) ^ (ulong)pDVar3);
      Cudd_Ref(pDVar3);
      *(DdNode **)((long)pvVar1 + 0x28) = pDVar3;
      lVar4 = lVar4 + 1;
      pVVar2 = p->vCos;
    } while (lVar4 < pVVar2->nSize);
  }
  Aig_ManResetRefs(p);
  if (fReorder != 0) {
    Cudd_ReduceHeap(unique,CUDD_REORDER_SYMM_SIFT,1);
    Cudd_AutodynDisable(unique);
  }
  return unique;
}

Assistant:

DdManager * Aig_ManComputeGlobalBdds( Aig_Man_t * p, int nBddSizeMax, int fDropInternal, int fReorder, int fVerbose )
{
    ProgressBar * pProgress = NULL;
    Aig_Obj_t * pObj;
    DdManager * dd;
    DdNode * bFunc;
    int i, Counter;
    // start the manager
    dd = Cudd_Init( Aig_ManCiNum(p), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    // set reordering
    if ( fReorder )
        Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );
    // prepare to construct global BDDs
    Aig_ManCleanData( p );
    // assign the constant node BDD
    Aig_ObjSetGlobalBdd( Aig_ManConst1(p), dd->one );   Cudd_Ref( dd->one );
    // set the elementary variables
    Aig_ManForEachCi( p, pObj, i )
    {
        Aig_ObjSetGlobalBdd( pObj, dd->vars[i] );  Cudd_Ref( dd->vars[i] );
    }

    // collect the global functions of the COs
    Counter = 0;
    // construct the BDDs
//    pProgress = Extra_ProgressBarStart( stdout, Aig_ManNodeNum(p) );
    Aig_ManForEachCo( p, pObj, i )
    {
        bFunc = Bbr_NodeGlobalBdds_rec( dd, Aig_ObjFanin0(pObj), nBddSizeMax, fDropInternal, pProgress, &Counter, fVerbose );
        if ( bFunc == NULL )
        {
            if ( fVerbose )
            printf( "Constructing global BDDs is aborted.\n" );
            Aig_ManFreeGlobalBdds( p, dd );
            Cudd_Quit( dd ); 
            // reset references
            Aig_ManResetRefs( p );
            return NULL;
        }
        bFunc = Cudd_NotCond( bFunc, Aig_ObjFaninC0(pObj) );  Cudd_Ref( bFunc ); 
        Aig_ObjSetGlobalBdd( pObj, bFunc );
    }
//    Extra_ProgressBarStop( pProgress );
    // reset references
    Aig_ManResetRefs( p );
    // reorder one more time
    if ( fReorder )
    {
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 1 );
        Cudd_AutodynDisable( dd );
    }
//    Cudd_PrintInfo( dd, stdout );
    return dd;
}